

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::ConnectionReceiver> __thiscall
kj::anon_unknown_30::LowLevelAsyncIoProviderImpl::wrapListenSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,NetworkFilter *filter,uint flags)

{
  undefined4 in_register_0000000c;
  ConnectionReceiver *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::ConnectionReceiver> OVar1;
  Own<kj::(anonymous_namespace)::FdConnectionReceiver> local_40;
  uint local_2c;
  NetworkFilter *pNStack_28;
  uint flags_local;
  NetworkFilter *filter_local;
  long lStack_18;
  int fd_local;
  LowLevelAsyncIoProviderImpl *this_local;
  
  lStack_18 = CONCAT44(in_register_00000034,fd);
  pNStack_28 = (NetworkFilter *)CONCAT44(in_register_0000000c,flags);
  filter_local._4_4_ = SUB84(filter,0);
  this_local = this;
  heap<kj::(anonymous_namespace)::FdConnectionReceiver,kj::UnixEventPort&,int&,kj::LowLevelAsyncIoProvider::NetworkFilter&,unsigned_int&>
            ((kj *)&local_40,(UnixEventPort *)(lStack_18 + 8),(int *)((long)&filter_local + 4),
             pNStack_28,&local_2c);
  Own<kj::ConnectionReceiver>::Own<kj::(anonymous_namespace)::FdConnectionReceiver,void>
            ((Own<kj::ConnectionReceiver> *)this,&local_40);
  Own<kj::(anonymous_namespace)::FdConnectionReceiver>::~Own(&local_40);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<ConnectionReceiver> wrapListenSocketFd(
      int fd, NetworkFilter& filter, uint flags = 0) override {
    return heap<FdConnectionReceiver>(eventPort, fd, filter, flags);
  }